

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ext_supported_groups_parse_clienthello
               (SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  bool bVar1;
  int iVar2;
  CBS supported_group_list;
  CBS local_20;
  
  if (contents != (CBS *)0x0) {
    iVar2 = CBS_get_u16_length_prefixed(contents,&local_20);
    bVar1 = false;
    if ((iVar2 != 0) && (local_20.len != 0)) {
      if (contents->len == 0) {
        bVar1 = parse_u16_array(&local_20,&hs->peer_supported_group_list);
      }
      else {
        bVar1 = false;
      }
    }
    return bVar1;
  }
  return true;
}

Assistant:

static bool ext_supported_groups_parse_clienthello(SSL_HANDSHAKE *hs,
                                                   uint8_t *out_alert,
                                                   CBS *contents) {
  if (contents == NULL) {
    return true;
  }

  CBS supported_group_list;
  if (!CBS_get_u16_length_prefixed(contents, &supported_group_list) ||  //
      CBS_len(&supported_group_list) == 0 ||                            //
      CBS_len(contents) != 0 ||                                         //
      !parse_u16_array(&supported_group_list, &hs->peer_supported_group_list)) {
    return false;
  }

  return true;
}